

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

void __thiscall amrex::Amr::regrid_level_0_on_restart(Amr *this)

{
  int iVar1;
  pointer pGVar2;
  pointer pIVar3;
  pointer puVar4;
  tuple<amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> tVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  bool bVar9;
  ostream *poVar10;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var11;
  uint uVar12;
  int dir;
  long lVar13;
  Box result;
  BoxArray lev0;
  int local_230 [6];
  undefined1 local_218 [24];
  undefined8 auStack_200 [47];
  BoxArray local_88;
  
  (anonymous_namespace)::regrid_on_restart = 0;
  pGVar2 = (this->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = *(long *)(pGVar2->domain).smallend.vect;
  lVar6 = *(long *)((long)&(pGVar2->domain).smallend + 8);
  lVar7 = *(long *)(pGVar2->domain).bigend.vect;
  uVar8 = *(undefined8 *)((long)&(pGVar2->domain).bigend + 8);
  local_218._16_4_ = (undefined4)((ulong)lVar7 >> 0x20);
  local_218._20_4_ = (undefined4)uVar8;
  auStack_200[0]._0_4_ = (uint)((ulong)uVar8 >> 0x20);
  local_218._8_4_ = (undefined4)lVar6;
  local_218._12_4_ = (undefined4)((ulong)lVar6 >> 0x20);
  local_230[3] = 2;
  local_230[4] = 2;
  local_230[5] = 2;
  local_218._0_4_ = (undefined4)lVar13;
  if ((int)local_218._0_4_ < 0) {
    local_218._0_4_ = local_218._0_4_ + 1;
    uVar12 = -local_218._0_4_;
    if (0 < (int)local_218._0_4_) {
      uVar12 = local_218._0_4_;
    }
    local_218._0_4_ = ~(uVar12 >> 1);
  }
  else {
    local_218._0_4_ = (uint)local_218._0_4_ >> 1;
  }
  local_218._4_4_ = (undefined4)((ulong)lVar13 >> 0x20);
  if (lVar13 < 0) {
    local_218._4_4_ = local_218._4_4_ + 1;
    uVar12 = -local_218._4_4_;
    if (0 < (int)local_218._4_4_) {
      uVar12 = local_218._4_4_;
    }
    local_218._4_4_ = ~(uVar12 >> 1);
  }
  else {
    local_218._4_4_ = (uint)local_218._4_4_ >> 1;
  }
  if ((int)local_218._8_4_ < 0) {
    local_218._8_4_ = local_218._8_4_ + 1;
    uVar12 = -local_218._8_4_;
    if (0 < (int)local_218._8_4_) {
      uVar12 = local_218._8_4_;
    }
    local_218._8_4_ = ~(uVar12 >> 1);
  }
  else {
    local_218._8_4_ = (uint)local_218._8_4_ >> 1;
  }
  if (auStack_200[0]._0_4_ == 0) {
    if (lVar6 < 0) {
      local_218._12_4_ = local_218._12_4_ + 1;
      uVar12 = -local_218._12_4_;
      if (0 < (int)local_218._12_4_) {
        uVar12 = local_218._12_4_;
      }
      local_218._12_4_ = ~(uVar12 >> 1);
    }
    else {
      local_218._12_4_ = (uint)local_218._12_4_ >> 1;
    }
    if (lVar7 < 0) {
      local_218._16_4_ = local_218._16_4_ + 1;
      uVar12 = -local_218._16_4_;
      if (0 < (int)local_218._16_4_) {
        uVar12 = local_218._16_4_;
      }
      local_218._16_4_ = ~(uVar12 >> 1);
    }
    else {
      local_218._16_4_ = (uint)local_218._16_4_ >> 1;
    }
    if ((int)local_218._20_4_ < 0) {
      local_218._20_4_ = local_218._20_4_ + 1;
      uVar12 = -local_218._20_4_;
      if (0 < (int)local_218._20_4_) {
        uVar12 = local_218._20_4_;
      }
      local_218._20_4_ = ~(uVar12 >> 1);
    }
    else {
      local_218._20_4_ = (uint)local_218._20_4_ >> 1;
    }
  }
  else {
    local_230[0] = 0;
    local_230[1] = 0;
    local_230[2] = 0;
    lVar13 = 0;
    do {
      if (((auStack_200[0]._0_4_ >> ((uint)lVar13 & 0x1f) & 1) != 0) &&
         (*(int *)(local_218 + lVar13 * 4 + 0xc) % local_230[lVar13 + 3] != 0)) {
        local_230[lVar13] = 1;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    if (lVar6 < 0) {
      local_218._12_4_ = local_218._12_4_ + 1;
      uVar12 = -local_218._12_4_;
      if (0 < (int)local_218._12_4_) {
        uVar12 = local_218._12_4_;
      }
      local_218._12_4_ = ~(uVar12 >> 1);
    }
    else {
      local_218._12_4_ = (uint)local_218._12_4_ >> 1;
    }
    if (lVar7 < 0) {
      local_218._16_4_ = local_218._16_4_ + 1;
      uVar12 = -local_218._16_4_;
      if (0 < (int)local_218._16_4_) {
        uVar12 = local_218._16_4_;
      }
      local_218._16_4_ = ~(uVar12 >> 1);
    }
    else {
      local_218._16_4_ = (uint)local_218._16_4_ >> 1;
    }
    if ((int)local_218._20_4_ < 0) {
      local_218._20_4_ = local_218._20_4_ + 1;
      uVar12 = -local_218._20_4_;
      if (0 < (int)local_218._20_4_) {
        uVar12 = local_218._20_4_;
      }
      local_218._20_4_ = ~(uVar12 >> 1);
    }
    else {
      local_218._20_4_ = (uint)local_218._20_4_ >> 1;
    }
    local_218._12_4_ = local_218._12_4_ + local_230[0];
    local_218._16_4_ = local_218._16_4_ + local_230[1];
    local_218._20_4_ = local_218._20_4_ + local_230[2];
  }
  BoxArray::BoxArray(&local_88,(Box *)local_218);
  pIVar3 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_grid_size.
           super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_218._8_4_ = pIVar3->vect[2] / 2;
  local_218._0_8_ = CONCAT44(pIVar3->vect[1] / 2,pIVar3->vect[0] / 2);
  BoxArray::maxSize(&local_88,(IntVect *)local_218);
  BoxArray::refine(&local_88,2);
  if (((anonymous_namespace)::use_efficient_regrid == 1) &&
     (bVar9 = BoxArray::operator==
                        (&local_88,
                         (BoxArray *)
                         ((long)(((this->amr_level).
                                  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         + 0xd8)), bVar9)) {
    if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
      poVar10 = OutStream();
      local_218._4_4_ = *(int *)(DAT_00756620 + -0x48);
      local_218._0_4_ = *(int *)(DAT_00756620 + -0x30);
      local_218._8_4_ = SUB84(poVar10,0);
      local_218._12_4_ = (undefined4)((ulong)poVar10 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_218 + 0x10));
      *(undefined8 *)
       ((long)auStack_200 + *(long *)(CONCAT44(local_218._20_4_,local_218._16_4_) + -0x18)) =
           *(undefined8 *)
            ((long)CONCAT44(local_218._12_4_,local_218._8_4_) +
            *(long *)(*(long *)CONCAT44(local_218._12_4_,local_218._8_4_) + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_218 + 0x10),"Regridding at level 0 but grids unchanged \n",0x2b);
      Print::~Print((Print *)local_218);
    }
  }
  else {
    DistributionMapping::DistributionMapping
              ((DistributionMapping *)local_218,&local_88,*(int *)(ParallelContext::frames + 0x10));
    _Var11.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>)
         (**(code **)(*(long *)this->levelbld + 0x30))
                   (SUB84(this->cumtime,0),this->levelbld,this,0,
                    (this->super_AmrCore).super_AmrMesh.geom.
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                    super__Vector_impl_data._M_start,&local_88,local_218);
    (**(code **)(*(long *)_Var11.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8))
              (_Var11.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
    puVar4 = (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tVar5.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> *)
          &(puVar4->_M_t).
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
    (puVar4->_M_t).super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> =
         _Var11.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
         super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl;
    if (tVar5.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::AmrLevel_*,_false>)0x0) {
      (**(code **)(*(long *)tVar5.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 8))();
    }
    AmrMesh::SetBoxArray
              ((AmrMesh *)this,0,
               (BoxArray *)
               ((long)(((this->amr_level).
                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
               + 0xd8));
    AmrMesh::SetDistributionMap
              ((AmrMesh *)this,0,
               (DistributionMapping *)
               ((long)(((this->amr_level).
                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
               + 0x140));
    _Var11.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         (((this->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
    (**(code **)(*(long *)_Var11.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x98))
              (_Var11.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,0,0);
    if (*(int *)(ParallelContext::frames + 0xc) == 0) {
      iVar1 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose;
      if (iVar1 < 2) {
        if (iVar1 == 1) {
          poVar10 = OutStream();
          AmrCore::printGridSummary
                    (&this->super_AmrCore,poVar10,0,
                     *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
        }
      }
      else {
        poVar10 = OutStream();
        printGridInfo(this,poVar10,0,
                      *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
    }
    if ((this->record_grid_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
      printGridInfo(this,(ostream *)&this->gridlog,0,
                    *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_218._12_4_,local_218._8_4_)
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_218._12_4_,local_218._8_4_));
    }
  }
  BoxArray::~BoxArray(&local_88);
  return;
}

Assistant:

void
Amr::regrid_level_0_on_restart()
{
    regrid_on_restart = 0;
    //
    // Coarsening before we split the grids ensures that each resulting
    // grid will have an even number of cells in each direction.
    //
    BoxArray lev0(amrex::coarsen(Geom(0).Domain(),2));
    //
    // Now split up into list of grids within max_grid_size[0] limit.
    //
    lev0.maxSize(max_grid_size[0]/2);
    //
    // Now refine these boxes back to level 0.
    //
    lev0.refine(2);

    //
    // If use_efficient_regrid flag is set, then test to see whether we in fact
    //    have just changed the level 0 grids. If not, then don't do anything more here.
    //
    if ( !( (use_efficient_regrid == 1) && (lev0 == amr_level[0]->boxArray()) ) )
    {
        //
        // Construct skeleton of new level.
        //
        DistributionMapping dm(lev0);
        AmrLevel* a = (*levelbld)(*this,0,Geom(0),lev0,dm,cumtime);

        a->init(*amr_level[0]);
        amr_level[0].reset(a);

        this->SetBoxArray(0, amr_level[0]->boxArray());
        this->SetDistributionMap(0, amr_level[0]->DistributionMap());

        amr_level[0]->post_regrid(0,0);

        if (ParallelDescriptor::IOProcessor())
        {
            if (verbose > 1)
            {
                printGridInfo(amrex::OutStream(),0,finest_level);
            }
            else if (verbose > 0)
            {
                printGridSummary(amrex::OutStream(),0,finest_level);
            }
        }

        if (record_grid_info && ParallelDescriptor::IOProcessor())
            printGridInfo(gridlog,0,finest_level);
    }
    else
    {
        if (verbose > 0)
            amrex::Print() << "Regridding at level 0 but grids unchanged \n";
    }
}